

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatetimeedit.cpp
# Opt level: O1

void __thiscall QDateTimeEditPrivate::interpret(QDateTimeEditPrivate *this,EmitPolicy ep)

{
  long *plVar1;
  int *piVar2;
  int iVar3;
  ulong uVar4;
  long in_FS_OFFSET;
  int pos;
  undefined4 local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  undefined1 *local_38;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  plVar1 = *(long **)&(this->super_QAbstractSpinBoxPrivate).super_QWidgetPrivate.field_0x8;
  local_38 = &DAT_aaaaaaaaaaaaaaaa;
  local_48 = 0xaaaaaaaa;
  uStack_44 = 0xaaaaaaaa;
  uStack_40 = 0xaaaaaaaa;
  uStack_3c = 0xaaaaaaaa;
  (**(code **)(*(long *)&(this->super_QAbstractSpinBoxPrivate).super_QWidgetPrivate + 0x110))
            (&local_48,this);
  QLineEdit::cursorPosition((this->super_QAbstractSpinBoxPrivate).edit);
  iVar3 = (**(code **)(*plVar1 + 0x1a0))(plVar1,&local_48);
  if ((iVar3 == 2) ||
     ((this->super_QAbstractSpinBoxPrivate).correctionMode != CorrectToPreviousValue)) {
LAB_003f0c2c:
    QAbstractSpinBoxPrivate::interpret(&this->super_QAbstractSpinBoxPrivate,ep);
  }
  else {
    if ((iVar3 != 0) && (-1 < *(int *)&this->field_0x3e0)) {
      uVar4 = QDateTimeParser::fieldInfo((int)this + 0x3d8);
      if ((uVar4 & 4) != 0) goto LAB_003f0c2c;
    }
    QAbstractSpinBoxPrivate::setValue
              (&this->super_QAbstractSpinBoxPrivate,&(this->super_QAbstractSpinBoxPrivate).value,ep,
               true);
    updateTimeZone(this);
  }
  piVar2 = (int *)CONCAT44(uStack_44,local_48);
  if (piVar2 != (int *)0x0) {
    LOCK();
    *piVar2 = *piVar2 + -1;
    UNLOCK();
    if (*piVar2 == 0) {
      QArrayData::deallocate((QArrayData *)CONCAT44(uStack_44,local_48),2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QDateTimeEditPrivate::interpret(EmitPolicy ep)
{
    Q_Q(QDateTimeEdit);
    QString tmp = displayText();
    int pos = edit->cursorPosition();
    const QValidator::State state = q->validate(tmp, pos);
    if (state != QValidator::Acceptable
        && correctionMode == QAbstractSpinBox::CorrectToPreviousValue
        && (state == QValidator::Invalid
            || currentSectionIndex < 0
            || !(fieldInfo(currentSectionIndex) & AllowPartial))) {
        setValue(value, ep);
        updateTimeZone();
    } else {
        QAbstractSpinBoxPrivate::interpret(ep);
    }
}